

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

void __thiscall Exception::~Exception(Exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_0011ad78;
  if (this->err_msg != (char *)0x0) {
    operator_delete__(this->err_msg);
  }
  pcVar1 = (this->err_word)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->err_word).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

Exception::~Exception() {
    delete []err_msg;
}